

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

void picojson::serialize_str<std::ostream_iterator<char,char,std::char_traits<char>>>
               (string *s,ostream_iterator<char,_char,_std::char_traits<char>_> *oi)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  ostream_type *poVar4;
  byte *__value;
  char buf [7];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_78;
  long local_68 [3];
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_50;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  
  local_78._M_stream = (ostream_type *)CONCAT71(local_78._M_stream._1_7_,0x22);
  local_50 = oi;
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(oi,(char *)&local_78);
  if (s->_M_string_length != 0) {
    __value = (byte *)(s->_M_dataplus)._M_p;
    do {
      bVar1 = *__value;
      if (0x21 < bVar1) {
        if (bVar1 == 0x5c) {
          local_78._M_stream = (ostream_type *)local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\\\","");
          local_48._M_stream = local_50->_M_stream;
          local_48._M_string = local_50->_M_string;
          if (0 < (long)local_78._M_string) {
            pcVar2 = local_78._M_string + 1;
            poVar4 = local_78._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_48,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while ((char *)0x1 < pcVar2);
          }
        }
        else if (bVar1 == 0x2f) {
          local_78._M_stream = (ostream_type *)local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\/","");
          local_48._M_stream = local_50->_M_stream;
          local_48._M_string = local_50->_M_string;
          if (0 < (long)local_78._M_string) {
            pcVar2 = local_78._M_string + 1;
            poVar4 = local_78._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_48,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while ((char *)0x1 < pcVar2);
          }
        }
        else {
          if (bVar1 != 0x22) goto switchD_00106eff_caseD_b;
          local_78._M_stream = (ostream_type *)local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\\"","");
          local_48._M_stream = local_50->_M_stream;
          local_48._M_string = local_50->_M_string;
          if (0 < (long)local_78._M_string) {
            pcVar2 = local_78._M_string + 1;
            poVar4 = local_78._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_48,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while ((char *)0x1 < pcVar2);
          }
        }
        goto LAB_001071f8;
      }
      switch(bVar1) {
      case 8:
        local_78._M_stream = (ostream_type *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\b","");
        local_48._M_stream = local_50->_M_stream;
        local_48._M_string = local_50->_M_string;
        if (0 < (long)local_78._M_string) {
          pcVar2 = local_78._M_string + 1;
          poVar4 = local_78._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_48,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while ((char *)0x1 < pcVar2);
        }
        break;
      case 9:
        local_78._M_stream = (ostream_type *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\t","");
        local_48._M_stream = local_50->_M_stream;
        local_48._M_string = local_50->_M_string;
        if (0 < (long)local_78._M_string) {
          pcVar2 = local_78._M_string + 1;
          poVar4 = local_78._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_48,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while ((char *)0x1 < pcVar2);
        }
        break;
      case 10:
        local_78._M_stream = (ostream_type *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\n","");
        local_48._M_stream = local_50->_M_stream;
        local_48._M_string = local_50->_M_string;
        if (0 < (long)local_78._M_string) {
          pcVar2 = local_78._M_string + 1;
          poVar4 = local_78._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_48,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while ((char *)0x1 < pcVar2);
        }
        break;
      default:
switchD_00106eff_caseD_b:
        if (bVar1 < 0x20 || bVar1 == 0x7f) {
          snprintf((char *)&local_48,7,"\\u%04x");
          local_78._M_stream = local_50->_M_stream;
          local_78._M_string = local_50->_M_string;
          lVar3 = 0;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_78,(char *)((long)&local_48._M_stream + lVar3));
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
        }
        else {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                    (local_50,(char *)__value);
        }
        goto LAB_00107212;
      case 0xc:
        local_78._M_stream = (ostream_type *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\f","");
        local_48._M_stream = local_50->_M_stream;
        local_48._M_string = local_50->_M_string;
        if (0 < (long)local_78._M_string) {
          pcVar2 = local_78._M_string + 1;
          poVar4 = local_78._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_48,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while ((char *)0x1 < pcVar2);
        }
        break;
      case 0xd:
        local_78._M_stream = (ostream_type *)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\\r","");
        local_48._M_stream = local_50->_M_stream;
        local_48._M_string = local_50->_M_string;
        if (0 < (long)local_78._M_string) {
          pcVar2 = local_78._M_string + 1;
          poVar4 = local_78._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_48,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while ((char *)0x1 < pcVar2);
        }
      }
LAB_001071f8:
      if (local_78._M_stream != (ostream_type *)local_68) {
        operator_delete(local_78._M_stream,local_68[0] + 1);
      }
LAB_00107212:
      __value = __value + 1;
    } while (__value != (byte *)((s->_M_dataplus)._M_p + s->_M_string_length));
  }
  local_78._M_stream = (ostream_type *)CONCAT71(local_78._M_stream._1_7_,0x22);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(local_50,(char *)&local_78);
  return;
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
	MAP('"', "\\\"");
	MAP('\\', "\\\\");
	MAP('/', "\\/");
	MAP('\b', "\\b");
	MAP('\f', "\\f");
	MAP('\n', "\\n");
	MAP('\r', "\\r");
	MAP('\t', "\\t");
#undef MAP
      default:
	if ((unsigned char)*i < 0x20 || *i == 0x7f) {
	  char buf[7];
	  SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
	  copy(buf, buf + 6, oi);
	  } else {
	  *oi++ = *i;
	}
	break;
      }
    }
    *oi++ = '"';
  }